

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O0

void __thiscall
packing::AssignedProtos::assign<packing::ProtoPalAttrs_const>
          (AssignedProtos *this,ProtoPalAttrs *args)

{
  bool bVar1;
  pointer this_00;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  local_40 [2];
  optional<packing::ProtoPalAttrs> *local_30;
  optional<packing::ProtoPalAttrs> *local_28;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  local_20;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  freeSlot;
  ProtoPalAttrs *args_local;
  AssignedProtos *this_local;
  
  freeSlot._M_current = (optional<packing::ProtoPalAttrs> *)args;
  local_28 = (optional<packing::ProtoPalAttrs> *)
             std::
             vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
             ::begin(&this->_assigned);
  local_30 = (optional<packing::ProtoPalAttrs> *)
             std::
             vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
             ::end(&this->_assigned);
  local_20 = std::
             find_if_not<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,packing::AssignedProtos::assign<packing::ProtoPalAttrs_const>(packing::ProtoPalAttrs_const&&)::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>
                       (local_28,local_30);
  local_40[0]._M_current =
       (optional<packing::ProtoPalAttrs> *)
       std::
       vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
       ::end(&this->_assigned);
  bVar1 = __gnu_cxx::
          operator==<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
                    (&local_20,local_40);
  if (bVar1) {
    std::
    vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>
    ::emplace_back<packing::ProtoPalAttrs_const>
              ((vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>
                *)this,(ProtoPalAttrs *)freeSlot._M_current);
  }
  else {
    this_00 = __gnu_cxx::
              __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
              ::operator->(&local_20);
    std::optional<packing::ProtoPalAttrs>::emplace<packing::ProtoPalAttrs_const>
              (this_00,(ProtoPalAttrs *)freeSlot._M_current);
  }
  return;
}

Assistant:

void assign(Ts &&...args) {
		auto freeSlot = std::find_if_not(
		    _assigned.begin(), _assigned.end(),
		    [](std::optional<ProtoPalAttrs> const &slot) { return slot.has_value(); });

		if (freeSlot == _assigned.end()) { // We are full, use a new slot
			_assigned.emplace_back(std::forward<Ts>(args)...);
		} else { // Reuse a free slot
			freeSlot->emplace(std::forward<Ts>(args)...);
		}
	}